

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# heap_string.hpp
# Opt level: O0

char * jsoncons::utility::
       launder_cast<char*,jsoncons::utility::heap_string<char,jsoncons::null_type,std::allocator<char>>>
                 (heap_string<char,_jsoncons::null_type,_std::allocator<char>_> *u)

{
  char *pcVar1;
  char *in_RDI;
  
  pcVar1 = std::launder<char>(in_RDI);
  return pcVar1;
}

Assistant:

T launder_cast(U* u)
    {
    #if defined(__cpp_lib_launder) && __cpp_lib_launder >= 201606
        return std::launder(reinterpret_cast<T>(u));
    #elif defined(__GNUC__) &&  (__GNUC__ * 100 + __GNUC_MINOR__) > 800
        return __builtin_launder(reinterpret_cast<T>(u));
    #else
        return reinterpret_cast<T>(u);
    #endif
    }